

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

ALLEGRO_THREAD * al_create_thread(_func_void_ptr_ALLEGRO_THREAD_ptr_void_ptr *proc,void *arg)

{
  ALLEGRO_THREAD *thread;
  
  thread = (ALLEGRO_THREAD *)
           al_malloc_with_context
                     (200,0x67,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/threads.c"
                      ,"create_thread");
  if (thread != (ALLEGRO_THREAD *)0x0) {
    (thread->mutex).inited = false;
    thread->retval = (void *)0x0;
  }
  thread->thread_state = THREAD_STATE_CREATED;
  _al_mutex_init(&thread->mutex);
  pthread_cond_init((pthread_cond_t *)&thread->cond,(pthread_condattr_t *)0x0);
  thread->arg = arg;
  thread->proc = proc;
  _al_thread_create((_AL_THREAD *)thread,thread_func_trampoline,thread);
  return thread;
}

Assistant:

ALLEGRO_THREAD *al_create_thread(
   void *(*proc)(ALLEGRO_THREAD *thread, void *arg), void *arg)
{
   ALLEGRO_THREAD *outer = create_thread();
   outer->thread_state = THREAD_STATE_CREATED;
   _al_mutex_init(&outer->mutex);
   _al_cond_init(&outer->cond);
   outer->arg = arg;
   outer->proc = proc;
   _al_thread_create(&outer->thread, thread_func_trampoline, outer);
   /* XXX _al_thread_create should return an error code */
   return outer;
}